

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_10x10(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  INT32 tmp10;
  INT32 tmp4;
  INT32 tmp3;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  int local_c4;
  int *local_b8;
  int *local_b0;
  int local_a8 [8];
  int local_88 [3];
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *wsptr;
  DCTELEM *dataptr;
  DCTELEM workspace [16];
  INT32 tmp14;
  INT32 tmp13;
  INT32 tmp12;
  INT32 tmp11;
  
  local_c4 = 0;
  local_b0 = in_RDI;
  while( true ) {
    while( true ) {
      pbVar1 = (byte *)(*(long *)(in_RSI + (long)local_c4 * 8) + (ulong)in_EDX);
      workspace._8_8_ = SEXT48((int)((uint)pbVar1[2] + (uint)pbVar1[7]));
      workspace._24_8_ =
           (long)(int)((uint)*pbVar1 + (uint)pbVar1[9]) +
           (long)(int)((uint)pbVar1[4] + (uint)pbVar1[5]);
      workspace._0_8_ =
           (long)(int)((uint)*pbVar1 + (uint)pbVar1[9]) -
           (long)(int)((uint)pbVar1[4] + (uint)pbVar1[5]);
      workspace._16_8_ =
           (long)(int)((uint)pbVar1[1] + (uint)pbVar1[8]) +
           (long)(int)((uint)pbVar1[3] + (uint)pbVar1[6]);
      dataptr = (DCTELEM *)
                ((long)(int)((uint)pbVar1[1] + (uint)pbVar1[8]) -
                (long)(int)((uint)pbVar1[3] + (uint)pbVar1[6]));
      lVar2 = (long)(int)((uint)*pbVar1 - (uint)pbVar1[9]);
      workspace._56_8_ = SEXT48((int)((uint)pbVar1[1] - (uint)pbVar1[8]));
      workspace._48_8_ = SEXT48((int)((uint)pbVar1[2] - (uint)pbVar1[7]));
      workspace._40_8_ = SEXT48((int)((uint)pbVar1[3] - (uint)pbVar1[6]));
      workspace._32_8_ = SEXT48((int)((uint)pbVar1[4] - (uint)pbVar1[5]));
      *local_b0 = ((int)workspace._24_8_ + (int)workspace._16_8_ + (uint)pbVar1[2] + (uint)pbVar1[7]
                  + -0x500) * 2;
      local_b0[4] = (int)(workspace._24_8_ * 0x249d + workspace._8_8_ * -0x2d42 +
                          workspace._16_8_ * -0xdfc + 0x800 >> 0xc);
      workspace._24_8_ = (workspace._0_8_ + (long)dataptr) * 0x1a9a;
      local_b0[2] = (int)(workspace._24_8_ + workspace._0_8_ * 0x1071 + 0x800 >> 0xc);
      local_b0[6] = (int)(workspace._24_8_ + (long)dataptr * -0x45a4 + 0x800 >> 0xc);
      workspace._24_8_ = lVar2 + workspace._32_8_;
      workspace._16_8_ = workspace._56_8_ - workspace._40_8_;
      local_b0[5] = (((int)workspace._24_8_ - (int)workspace._16_8_) - (int)workspace._48_8_) * 2;
      workspace._48_8_ = workspace._48_8_ * 0x2000;
      local_b0[1] = (int)(lVar2 * 0x2cb3 + workspace._56_8_ * 0x2853 + workspace._48_8_ +
                          workspace._40_8_ * 0x148c + workspace._32_8_ * 0x714 + 0x800 >> 0xc);
      workspace._8_8_ =
           (lVar2 - workspace._32_8_) * 0x1e6f + (workspace._56_8_ + workspace._40_8_) * -0x12cf;
      workspace._0_8_ = (workspace._24_8_ * 0x9e3 + workspace._16_8_ * 0x19e3) - workspace._48_8_;
      local_b0[3] = (int)(workspace._8_8_ + workspace._0_8_ + 0x800 >> 0xc);
      local_b0[7] = (int)((workspace._8_8_ - workspace._0_8_) + 0x800 >> 0xc);
      local_c4 = local_c4 + 1;
      if (local_c4 != 8) break;
      local_b0 = local_a8;
    }
    if (local_c4 == 10) break;
    local_b0 = local_b0 + 8;
  }
  local_b8 = local_a8;
  local_b0 = in_RDI;
  for (local_c4 = 7; -1 < local_c4; local_c4 = local_c4 + -1) {
    lVar2 = (long)(local_b0[0x10] + local_b0[0x38]);
    lVar3 = (long)(*local_b0 + local_b8[8]) + (long)(local_b0[0x20] + local_b0[0x28]);
    lVar4 = (long)(*local_b0 + local_b8[8]) - (long)(local_b0[0x20] + local_b0[0x28]);
    lVar5 = (long)(local_b0[8] + *local_b8) + (long)(local_b0[0x18] + local_b0[0x30]);
    lVar6 = (long)(local_b0[8] + *local_b8) - (long)(local_b0[0x18] + local_b0[0x30]);
    lVar7 = (long)(*local_b0 - local_b8[8]);
    lVar8 = (long)(local_b0[8] - *local_b8);
    lVar9 = (long)(local_b0[0x10] - local_b0[0x38]);
    lVar10 = (long)(local_b0[0x18] - local_b0[0x30]);
    lVar11 = (long)(local_b0[0x20] - local_b0[0x28]);
    *local_b0 = (int)((lVar3 + lVar5 + lVar2) * 0x28f6 + 0x4000 >> 0xf);
    local_b0[0x20] =
         (int)((lVar3 + lVar2 * -2) * 0x2edd + (lVar5 + lVar2 * -2) * -0x11e6 + 0x4000 >> 0xf);
    lVar2 = (lVar4 + lVar6) * 0x220c;
    local_b0[0x10] = (int)(lVar2 + lVar4 * 0x150b + 0x4000 >> 0xf);
    local_b0[0x30] = (int)(lVar2 + lVar6 * -0x5924 + 0x4000 >> 0xf);
    lVar2 = lVar8 - lVar10;
    local_b0[0x28] = (int)((((lVar7 + lVar11) - lVar2) - lVar9) * 0x28f6 + 0x4000 >> 0xf);
    local_b0[8] = (int)(lVar7 * 0x3937 + lVar8 * 0x339d + lVar9 * 0x28f6 + lVar10 * 0x1a4c +
                        lVar11 * 0x910 + 0x4000 >> 0xf);
    lVar3 = (lVar7 - lVar11) * 0x26f5 + (lVar8 + lVar10) * -0x1813;
    lVar2 = (lVar7 + lVar11 + lVar2) * 0xca8 + lVar2 * 0x147b + lVar9 * -0x28f6;
    local_b0[0x18] = (int)(lVar3 + lVar2 + 0x4000 >> 0xf);
    local_b0[0x38] = (int)((lVar3 - lVar2) + 0x4000 >> 0xf);
    local_b0 = local_b0 + 1;
    local_b8 = local_b8 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_10x10 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14;
  DCTELEM workspace[8*2];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* we scale the results further by 2 as part of output adaption */
  /* scaling for different DCT size. */
  /* cK represents sqrt(2) * cos(K*pi/20). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[9]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[8]);
    tmp12 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[7]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[6]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[5]);

    tmp10 = tmp0 + tmp4;
    tmp13 = tmp0 - tmp4;
    tmp11 = tmp1 + tmp3;
    tmp14 = tmp1 - tmp3;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[9]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[8]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[7]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[6]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[5]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp11 + tmp12 - 10 * CENTERJSAMPLE) << 1);
    tmp12 += tmp12;
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.144122806)) - /* c4 */
	      MULTIPLY(tmp11 - tmp12, FIX(0.437016024)),  /* c8 */
	      CONST_BITS-1);
    tmp10 = MULTIPLY(tmp13 + tmp14, FIX(0.831253876));    /* c6 */
    dataptr[2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp13, FIX(0.513743148)),  /* c2-c6 */
	      CONST_BITS-1);
    dataptr[6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(2.176250899)),  /* c2+c6 */
	      CONST_BITS-1);

    /* Odd part */

    tmp10 = tmp0 + tmp4;
    tmp11 = tmp1 - tmp3;
    dataptr[5] = (DCTELEM) ((tmp10 - tmp11 - tmp2) << 1);
    tmp2 <<= CONST_BITS;
    dataptr[1] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0, FIX(1.396802247)) +          /* c1 */
	      MULTIPLY(tmp1, FIX(1.260073511)) + tmp2 +   /* c3 */
	      MULTIPLY(tmp3, FIX(0.642039522)) +          /* c7 */
	      MULTIPLY(tmp4, FIX(0.221231742)),           /* c9 */
	      CONST_BITS-1);
    tmp12 = MULTIPLY(tmp0 - tmp4, FIX(0.951056516)) -     /* (c3+c7)/2 */
	    MULTIPLY(tmp1 + tmp3, FIX(0.587785252));      /* (c1-c9)/2 */
    tmp13 = MULTIPLY(tmp10 + tmp11, FIX(0.309016994)) +   /* (c3-c7)/2 */
	    (tmp11 << (CONST_BITS - 1)) - tmp2;
    dataptr[3] = (DCTELEM) DESCALE(tmp12 + tmp13, CONST_BITS-1);
    dataptr[7] = (DCTELEM) DESCALE(tmp12 - tmp13, CONST_BITS-1);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == 10)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * We must also scale the output by (8/10)**2 = 16/25, which we partially
   * fold into the constant multipliers and final/initial shifting:
   * cK now represents sqrt(2) * cos(K*pi/20) * 32/25.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*1];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*0];
    tmp12 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*7];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*6];
    tmp4 = dataptr[DCTSIZE*4] + dataptr[DCTSIZE*5];

    tmp10 = tmp0 + tmp4;
    tmp13 = tmp0 - tmp4;
    tmp11 = tmp1 + tmp3;
    tmp14 = tmp1 - tmp3;

    tmp0 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*1];
    tmp1 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*0];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*7];
    tmp3 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*6];
    tmp4 = dataptr[DCTSIZE*4] - dataptr[DCTSIZE*5];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11 + tmp12, FIX(1.28)), /* 32/25 */
	      CONST_BITS+2);
    tmp12 += tmp12;
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.464477191)) - /* c4 */
	      MULTIPLY(tmp11 - tmp12, FIX(0.559380511)),  /* c8 */
	      CONST_BITS+2);
    tmp10 = MULTIPLY(tmp13 + tmp14, FIX(1.064004961));    /* c6 */
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp13, FIX(0.657591230)),  /* c2-c6 */
	      CONST_BITS+2);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(2.785601151)),  /* c2+c6 */
	      CONST_BITS+2);

    /* Odd part */

    tmp10 = tmp0 + tmp4;
    tmp11 = tmp1 - tmp3;
    dataptr[DCTSIZE*5] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp11 - tmp2, FIX(1.28)),  /* 32/25 */
	      CONST_BITS+2);
    tmp2 = MULTIPLY(tmp2, FIX(1.28));                     /* 32/25 */
    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0, FIX(1.787906876)) +          /* c1 */
	      MULTIPLY(tmp1, FIX(1.612894094)) + tmp2 +   /* c3 */
	      MULTIPLY(tmp3, FIX(0.821810588)) +          /* c7 */
	      MULTIPLY(tmp4, FIX(0.283176630)),           /* c9 */
	      CONST_BITS+2);
    tmp12 = MULTIPLY(tmp0 - tmp4, FIX(1.217352341)) -     /* (c3+c7)/2 */
	    MULTIPLY(tmp1 + tmp3, FIX(0.752365123));      /* (c1-c9)/2 */
    tmp13 = MULTIPLY(tmp10 + tmp11, FIX(0.395541753)) +   /* (c3-c7)/2 */
	    MULTIPLY(tmp11, FIX(0.64)) - tmp2;            /* 16/25 */
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp12 + tmp13, CONST_BITS+2);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp12 - tmp13, CONST_BITS+2);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}